

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.cpp
# Opt level: O3

void Diligent::anon_unknown_61::ValidateComputePipelineCreateInfo
               (ComputePipelineStateCreateInfo *CreateInfo,IRenderDevice *pDevice)

{
  PIPELINE_TYPE PipelineType;
  char *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char (*in_RCX) [19];
  IShader *pIVar3;
  char *local_48;
  string msg;
  
  if (pDevice == (IRenderDevice *)0x0) {
    FormatString<char[26],char[19]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x7f28d3,in_RCX);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ValidateComputePipelineCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x2a5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  iVar2 = (*(pDevice->super_IObject)._vptr_IObject[0x18])(pDevice);
  PipelineType = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType;
  if (PipelineType != PIPELINE_TYPE_COMPUTE) {
    msg._M_dataplus._M_p = GetPipelineTypeString(PipelineType);
    pcVar1 = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name;
    local_48 = "";
    if (pcVar1 != (char *)0x0) {
      local_48 = pcVar1;
    }
    LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[31]>
              (false,"ValidateComputePipelineCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x2aa,(char (*) [16])"Description of ",(char **)&msg,(char (*) [7])0x8146c6,
               &local_48,(char (*) [15])"\' is invalid: ",
               (char (*) [31])"Pipeline type must be COMPUTE.");
  }
  ValidatePipelineResourceSignatures(&CreateInfo->super_PipelineStateCreateInfo,pDevice);
  ValidatePipelineResourceLayoutDesc
            ((PipelineStateDesc *)CreateInfo,(DeviceFeatures *)(CONCAT44(extraout_var,iVar2) + 0xc))
  ;
  pIVar3 = CreateInfo->pCS;
  if (pIVar3 == (IShader *)0x0) {
    msg._M_dataplus._M_p =
         GetPipelineTypeString((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType);
    pcVar1 = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name;
    local_48 = "";
    if (pcVar1 != (char *)0x0) {
      local_48 = pcVar1;
    }
    LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[33]>
              (false,"ValidateComputePipelineCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x2b0,(char (*) [16])"Description of ",(char **)&msg,(char (*) [7])0x8146c6,
               &local_48,(char (*) [15])"\' is invalid: ",
               (char (*) [33])"Compute shader must not be null.");
    pIVar3 = CreateInfo->pCS;
    if (pIVar3 == (IShader *)0x0) {
      return;
    }
  }
  iVar2 = (*(pIVar3->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  if (*(int *)(CONCAT44(extraout_var_00,iVar2) + 8) != 0x20) {
    iVar2 = (*(CreateInfo->pCS->super_IDeviceObject).super_IObject._vptr_IObject[4])();
    msg._M_dataplus._M_p =
         GetShaderTypeLiteralName(*(SHADER_TYPE *)(CONCAT44(extraout_var_01,iVar2) + 8));
    LogError<true,char_const*,char[26],char[8],char[8]>
              (false,"ValidateComputePipelineCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x2b2,(char **)&msg,(char (*) [26])" is not a valid type for ",
               (char (*) [8])0x8d28f5,(char (*) [8])0x88d900);
  }
  return;
}

Assistant:

void ValidateComputePipelineCreateInfo(const ComputePipelineStateCreateInfo& CreateInfo,
                                       const IRenderDevice*                  pDevice) noexcept(false)
{
    VERIFY_EXPR(pDevice != nullptr);
    const DeviceFeatures& Features = pDevice->GetDeviceInfo().Features;

    const PipelineStateDesc& PSODesc = CreateInfo.PSODesc;
    if (PSODesc.PipelineType != PIPELINE_TYPE_COMPUTE)
        LOG_PSO_ERROR_AND_THROW("Pipeline type must be COMPUTE.");

    ValidatePipelineResourceSignatures(CreateInfo, pDevice);
    ValidatePipelineResourceLayoutDesc(PSODesc, Features);

    if (CreateInfo.pCS == nullptr)
        LOG_PSO_ERROR_AND_THROW("Compute shader must not be null.");

    VALIDATE_SHADER_TYPE(CreateInfo.pCS, SHADER_TYPE_COMPUTE, "compute")
}